

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_allocation.c
# Opt level: O0

void PaUtil_GroupFreeMemory(PaUtilAllocationGroup *group,void *buffer)

{
  long in_RSI;
  long in_RDI;
  PaUtilAllocationGroupLink *previous;
  PaUtilAllocationGroupLink *current;
  undefined8 *local_20;
  undefined8 *local_18;
  
  local_18 = *(undefined8 **)(in_RDI + 0x18);
  local_20 = (undefined8 *)0x0;
  if (in_RSI != 0) {
    for (; local_18 != (undefined8 *)0x0; local_18 = (undefined8 *)*local_18) {
      if (local_18[1] == in_RSI) {
        if (local_20 == (undefined8 *)0x0) {
          *(undefined8 *)(in_RDI + 0x18) = *local_18;
        }
        else {
          *local_20 = *local_18;
        }
        local_18[1] = 0;
        *local_18 = *(undefined8 *)(in_RDI + 0x10);
        *(undefined8 **)(in_RDI + 0x10) = local_18;
        break;
      }
      local_20 = local_18;
    }
    PaUtil_FreeMemory((void *)0x107c1f);
  }
  return;
}

Assistant:

void PaUtil_GroupFreeMemory( PaUtilAllocationGroup* group, void *buffer )
{
    struct PaUtilAllocationGroupLink *current = group->allocations;
    struct PaUtilAllocationGroupLink *previous = 0;

    if( buffer == 0 )
        return;

    /* find the right link and remove it */
    while( current )
    {
        if( current->buffer == buffer )
        {
            if( previous )
            {
                previous->next = current->next;
            }
            else
            {
                group->allocations = current->next;
            }

            current->buffer = 0;
            current->next = group->spareLinks;
            group->spareLinks = current;

            break;
        }
        
        previous = current;
        current = current->next;
    }

    PaUtil_FreeMemory( buffer ); /* free the memory whether we found it in the list or not */
}